

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::RenderPassVkImpl::CreateRenderPass<1ul>(RenderPassVkImpl *this)

{
  pointer pcVar1;
  VkBool32 VVar2;
  Uint32 UVar3;
  RenderPassAttachmentDesc *pRVar4;
  AttachmentReference *pAVar5;
  Uint32 *pUVar6;
  ShadingRateAttachment *pSrcAttachments;
  SubpassDependencyDesc *pSVar7;
  pointer pVVar8;
  undefined8 uVar9;
  pointer pRVar10;
  pointer pVVar11;
  pointer pVVar12;
  VkFormat VVar13;
  VkAttachmentLoadOp VVar14;
  VkAttachmentStoreOp VVar15;
  VkImageLayout VVar16;
  VkPipelineStageFlags VVar17;
  VkAccessFlags VVar18;
  value_type *pvVar19;
  VkAttachmentReference2 *pVVar20;
  uint uVar21;
  AttachmentReference *pAVar22;
  char (*Args_1) [60];
  Uint32 attachment;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  size_type __n;
  size_type __n_00;
  SubpassDesc *pSVar29;
  RenderPassVkImpl *pRVar30;
  Uint32 i;
  long lVar31;
  long lVar32;
  bool FragDensityMapEnabled;
  vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_> vkDependencies;
  Uint32 CurrAttachmentReferenceInd;
  VkRenderPassFragmentDensityMapCreateInfoEXT FragDensityMapCI;
  vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_> AttachmentStates;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vkPreserveAttachments;
  vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> vkAttachmentReferences;
  vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> vkSubpasses;
  vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_> vkAttachments;
  vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
  vkShadingRate;
  RenderPassCIType RenderPassCI;
  bool local_191;
  ShadingRateAttachment *local_190;
  uint local_184;
  undefined1 local_180 [16];
  vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> local_170;
  RenderPassVkImpl *local_158;
  VkBool32 local_150;
  undefined1 local_14c [4];
  string local_148;
  vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_> local_120;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> local_f0;
  vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_> local_d8;
  vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_> local_c0;
  element_type *local_a8;
  vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
  local_a0;
  VkRenderPassCreateInfo local_88;
  RenderPassWrapper local_48;
  
  local_a8 = (((this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
              .m_pDevice)->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  VVar2 = (local_a8->m_EnabledExtFeatures).ShadingRate.attachmentFragmentShadingRate;
  local_191 = (local_a8->m_EnabledExtFeatures).FragmentDensityMap.fragmentDensityMap != 0;
  local_88.pAttachments = (VkAttachmentDescription *)0x0;
  local_88.dependencyCount = 0;
  local_88._52_4_ = 0;
  local_88.pDependencies = (VkSubpassDependency *)0x0;
  local_88.subpassCount = 0;
  local_88._36_4_ = 0;
  local_88.pSubpasses = (VkSubpassDescription *)0x0;
  local_88.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_88._4_4_ = 0;
  local_88.pNext = (string *)0x0;
  local_88.flags = 0;
  local_88.attachmentCount = 0;
  std::vector<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>::vector
            (&local_c0,
             (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    .m_Desc.AttachmentCount,(allocator_type *)local_180);
  uVar21 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
           .m_Desc.AttachmentCount;
  local_150 = VVar2;
  if (uVar21 != 0) {
    lVar31 = 0x20;
    lVar32 = 0;
    uVar28 = 0;
    do {
      pVVar12 = local_c0.
                super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar4 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
               .m_Desc.pAttachments;
      *(undefined4 *)
       ((long)local_c0.
              super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar31 + -0x20) = 0;
      VVar13 = TexFormatToVkFormat(*(TEXTURE_FORMAT *)((long)&pRVar4->Format + lVar32));
      *(VkFormat *)((long)pVVar12 + lVar31 + -0x1c) = VVar13;
      *(uint *)((long)pVVar12 + lVar31 + -0x18) = (uint)(&pRVar4->SampleCount)[lVar32];
      VVar14 = AttachmentLoadOpToVkAttachmentLoadOp((&pRVar4->LoadOp)[lVar32]);
      *(VkAttachmentLoadOp *)((long)pVVar12 + lVar31 + -0x14) = VVar14;
      VVar15 = AttachmentStoreOpToVkAttachmentStoreOp((&pRVar4->StoreOp)[lVar32]);
      *(VkAttachmentStoreOp *)((long)pVVar12 + lVar31 + -0x10) = VVar15;
      VVar14 = AttachmentLoadOpToVkAttachmentLoadOp((&pRVar4->StencilLoadOp)[lVar32]);
      *(VkAttachmentLoadOp *)((long)pVVar12 + lVar31 + -0xc) = VVar14;
      VVar15 = AttachmentStoreOpToVkAttachmentStoreOp((&pRVar4->StencilStoreOp)[lVar32]);
      *(VkAttachmentStoreOp *)((long)pVVar12 + lVar31 + -8) = VVar15;
      VVar16 = ResourceStateToVkImageLayout
                         (*(RESOURCE_STATE *)((long)&pRVar4->InitialState + lVar32),false,local_191)
      ;
      *(VkImageLayout *)((long)pVVar12 + lVar31 + -4) = VVar16;
      VVar16 = ResourceStateToVkImageLayout
                         (*(RESOURCE_STATE *)((long)&pRVar4->FinalState + lVar32),true,local_191);
      *(VkImageLayout *)((long)&pVVar12->flags + lVar31) = VVar16;
      uVar28 = uVar28 + 1;
      uVar21 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
               .m_Desc.AttachmentCount;
      lVar32 = lVar32 + 0x10;
      lVar31 = lVar31 + 0x24;
    } while (uVar28 < uVar21);
  }
  local_88.attachmentCount = uVar21;
  local_88.pAttachments =
       local_c0.
       super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>._M_impl
       .super__Vector_impl_data._M_start;
  uVar28 = (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                  .m_Desc.SubpassCount;
  __n = 0;
  if (uVar28 == 0) {
    __n_00 = 0;
    uVar28 = 0;
  }
  else {
    pSVar29 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
              .m_Desc.pSubpasses;
    lVar31 = 0;
    uVar25 = 0;
    uVar21 = 0;
    uVar26 = 0;
    do {
      iVar27 = *(int *)((long)&pSVar29->RenderTargetAttachmentCount + lVar31);
      iVar24 = uVar25 + *(int *)((long)&pSVar29->InputAttachmentCount + lVar31) + iVar27;
      if (*(long *)((long)&pSVar29->pResolveAttachments + lVar31) == 0) {
        iVar27 = 0;
      }
      uVar25 = (iVar24 + iVar27 + 1) -
               (uint)(*(long *)((long)&pSVar29->pDepthStencilAttachment + lVar31) == 0);
      uVar26 = uVar26 + (*(long *)((long)&pSVar29->pShadingRateAttachment + lVar31) != 0 &&
                        local_150 != 0);
      uVar21 = uVar21 + *(int *)((long)&pSVar29->PreserveAttachmentCount + lVar31);
      lVar31 = lVar31 + 0x48;
    } while (uVar28 * 0x48 != lVar31);
    uVar28 = (ulong)uVar25;
    __n = (size_type)uVar26;
    __n_00 = (size_type)uVar21;
  }
  std::vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>::vector
            (&local_f0,uVar28 + __n,(allocator_type *)local_180);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_108,__n_00,(allocator_type *)local_180);
  std::
  vector<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
  ::vector(&local_a0,__n,(allocator_type *)local_180);
  local_14c = (undefined1  [4])0x0;
  std::vector<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>::vector
            (&local_120,
             (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    .m_Desc.AttachmentCount,(allocator_type *)local_180);
  std::vector<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>::vector
            (&local_d8,
             (ulong)(this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    .m_Desc.SubpassCount,(allocator_type *)local_180);
  local_170.super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = this;
  if ((this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount == 0) {
    local_190 = (ShadingRateAttachment *)0x0;
  }
  else {
    uVar28 = 0;
    local_190 = (ShadingRateAttachment *)0x0;
    uVar21 = 0;
    do {
      pVVar11 = local_d8.
                super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pRVar10 = local_120.
                super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar29 = (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                .m_Desc.pSubpasses + uVar28;
      local_d8.super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar28].flags = 0;
      local_d8.super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar28].pipelineBindPoint =
           VK_PIPELINE_BIND_POINT_GRAPHICS;
      local_184 = uVar21;
      if (local_120.
          super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_120.
          super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        memset(local_120.
               super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
               ._M_impl.super__Vector_impl_data._M_start,0,
               ((long)local_120.
                      super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                      ._M_impl.super__Vector_impl_data._M_finish +
                (-4 - (long)local_120.
                            super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                            ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
      }
      uVar21 = pSVar29->InputAttachmentCount;
      pAVar22 = pSVar29->pInputAttachments;
      if (pAVar22 != (AttachmentReference *)0x0 && (ulong)uVar21 != 0) {
        uVar23 = 0;
        do {
          if ((ulong)pAVar22[uVar23].AttachmentIndex != 0xffffffff) {
            pRVar10[pAVar22[uVar23].AttachmentIndex] =
                 pRVar10[pAVar22[uVar23].AttachmentIndex] | pAVar22[uVar23].State;
          }
          uVar23 = uVar23 + 1;
        } while (uVar21 != uVar23);
      }
      uVar21 = pSVar29->RenderTargetAttachmentCount;
      pAVar22 = pSVar29->pRenderTargetAttachments;
      if (pAVar22 != (AttachmentReference *)0x0 && (ulong)uVar21 != 0) {
        uVar23 = 0;
        do {
          if ((ulong)pAVar22[uVar23].AttachmentIndex != 0xffffffff) {
            pRVar10[pAVar22[uVar23].AttachmentIndex] =
                 pRVar10[pAVar22[uVar23].AttachmentIndex] | pAVar22[uVar23].State;
          }
          uVar23 = uVar23 + 1;
        } while (uVar21 != uVar23);
      }
      pAVar5 = pSVar29->pDepthStencilAttachment;
      if ((pAVar5 != (AttachmentReference *)0x0) &&
         (pAVar22 = (AttachmentReference *)(ulong)pAVar5->AttachmentIndex,
         pAVar22 != (AttachmentReference *)0xffffffff)) {
        pRVar10[(long)pAVar22] = pRVar10[(long)pAVar22] | pAVar5->State;
      }
      local_180._0_8_ = &local_f0;
      local_180._8_8_ = local_14c;
      local_170.super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_120;
      local_170.super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_191;
      UVar3 = pSVar29->InputAttachmentCount;
      pVVar11[uVar28].inputAttachmentCount = UVar3;
      if (UVar3 != 0) {
        pAVar22 = (AttachmentReference *)0x1;
        pvVar19 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                            ((anon_class_32_4_53ae7d20 *)local_180,UVar3,pSVar29->pInputAttachments,
                             1);
        pVVar11[uVar28].pInputAttachments = pvVar19;
      }
      UVar3 = pSVar29->RenderTargetAttachmentCount;
      pVVar11[uVar28].colorAttachmentCount = UVar3;
      if (UVar3 != 0) {
        pAVar22 = (AttachmentReference *)0x1;
        pvVar19 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                            ((anon_class_32_4_53ae7d20 *)local_180,UVar3,
                             pSVar29->pRenderTargetAttachments,1);
        pVVar11[uVar28].pColorAttachments = pvVar19;
        if (pSVar29->pResolveAttachments != (AttachmentReference *)0x0) {
          pAVar22 = (AttachmentReference *)0x1;
          pvVar19 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                              ((anon_class_32_4_53ae7d20 *)local_180,
                               pSVar29->RenderTargetAttachmentCount,pSVar29->pResolveAttachments,1);
          pVVar11[uVar28].pResolveAttachments = pvVar19;
        }
      }
      if (pSVar29->pDepthStencilAttachment != (AttachmentReference *)0x0) {
        pAVar22 = (AttachmentReference *)0x6;
        pvVar19 = CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                            ((anon_class_32_4_53ae7d20 *)local_180,1,
                             pSVar29->pDepthStencilAttachment,6);
        pVVar11[uVar28].pDepthStencilAttachment = pvVar19;
      }
      pVVar8 = local_a0.
               super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this = local_158;
      uVar21 = local_184;
      UVar3 = pSVar29->PreserveAttachmentCount;
      pVVar11[uVar28].preserveAttachmentCount = UVar3;
      if (UVar3 != 0) {
        pVVar11[uVar28].pPreserveAttachments =
             local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start +
             ((ulong)local_170.
                     super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff);
        pAVar22 = (AttachmentReference *)
                  local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pSVar29->PreserveAttachmentCount != 0) {
          pUVar6 = pSVar29->pPreserveAttachments;
          uVar23 = 0;
          do {
            local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(uint)((int)local_170.
                         super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + (int)uVar23)] =
                 pUVar6[uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar23 < pSVar29->PreserveAttachmentCount);
          local_170.
          super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)(ulong)(uint)((int)local_170.
                                           super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                     (int)uVar23);
        }
      }
      pSrcAttachments = pSVar29->pShadingRateAttachment;
      if (pSrcAttachments != (ShadingRateAttachment *)0x0) {
        if (local_150 == 0) {
          if (local_191 == false) {
            FormatString<char[26],char[22]>
                      (&local_148,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"FragDensityMapEnabled",(char (*) [22])pAVar22);
            DebugAssertionFailed
                      (local_148._M_dataplus._M_p,"CreateRenderPass",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                       ,0x11b);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
          }
          uVar21 = local_184;
          if (local_190 == (ShadingRateAttachment *)0x0) {
            local_190 = pSVar29->pShadingRateAttachment;
          }
        }
        else {
          uVar23 = (ulong)local_184;
          local_a0.
          super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar23].pNext = (void *)0x0;
          local_a0.
          super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar23].sType =
               VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR;
          pVVar20 = (VkAttachmentReference2 *)
                    CreateRenderPass<1UL>::anon_class_32_4_53ae7d20::operator()
                              ((anon_class_32_4_53ae7d20 *)local_180,1,&pSrcAttachments->Attachment,
                               1);
          pVVar8[uVar23].pFragmentShadingRateAttachment = pVVar20;
          UVar3 = pSrcAttachments->TileSize[1];
          pVVar8 = pVVar8 + uVar23;
          (pVVar8->shadingRateAttachmentTexelSize).width = pSrcAttachments->TileSize[0];
          (pVVar8->shadingRateAttachmentTexelSize).height = UVar3;
          this = local_158;
          uVar21 = uVar21 + 1;
        }
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 < (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                      .m_Desc.SubpassCount);
    local_170.super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)local_170.
                          super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff);
  }
  if (((local_191 == true) && (local_190 != (ShadingRateAttachment *)0x0)) &&
     ((local_158->super_RenderPassBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
      .m_Desc.SubpassCount != 0)) {
    lVar31 = 0x40;
    uVar28 = 0;
    do {
      pSVar29 = (local_158->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                .m_Desc.pSubpasses;
      if (*(long *)((long)&pSVar29->InputAttachmentCount + lVar31) == 0) {
        LogError<true,char[107]>
                  (false,"CreateRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                   ,0x128,(char (*) [107])
                          "Vk_EXT_fragment_density_map extension requires that shading rate attachment is specified for all subpasses"
                  );
      }
      pUVar6 = *(Uint32 **)((long)&pSVar29->InputAttachmentCount + lVar31);
      if ((((local_190->Attachment).AttachmentIndex != *pUVar6) ||
          ((local_190->Attachment).State != pUVar6[1])) ||
         ((local_190->TileSize[0] != pUVar6[2] || (local_190->TileSize[1] != pUVar6[3])))) {
        LogError<true,char[106]>
                  (false,"CreateRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                   ,299,(char (*) [106])
                        "Vk_EXT_fragment_density_map extension requires that shading rate attachment is the same for all subpasses"
                  );
      }
      uVar28 = uVar28 + 1;
      lVar31 = lVar31 + 0x48;
    } while (uVar28 < (local_158->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                      .m_Desc.SubpassCount);
  }
  pRVar30 = local_158;
  Args_1 = (char (*) [60])
           ((long)local_f0.
                  super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_f0.
                  super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3);
  if (Args_1 != (char (*) [60])(ulong)(uint)local_14c) {
    FormatString<char[26],char[60]>
              ((string *)local_180,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrAttachmentReferenceInd == vkAttachmentReferences.size()",Args_1);
    Args_1 = (char (*) [60])0x12f;
    DebugAssertionFailed
              ((Char *)local_180._0_8_,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x12f);
    if ((vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)local_180._0_8_ !=
        &local_170) {
      operator_delete((void *)local_180._0_8_,
                      (ulong)((long)local_170.
                                    super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  if ((pointer)((long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) !=
      local_170.super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    FormatString<char[26],char[58]>
              ((string *)local_180,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CurrPreserveAttachmentInd == vkPreserveAttachments.size()",
               (char (*) [58])Args_1);
    DebugAssertionFailed
              ((Char *)local_180._0_8_,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x130);
    if ((vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)local_180._0_8_ !=
        &local_170) {
      operator_delete((void *)local_180._0_8_,
                      (ulong)((long)local_170.
                                    super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
  }
  local_88.subpassCount =
       (pRVar30->super_RenderPassBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
       .m_Desc.SubpassCount;
  local_88.pSubpasses =
       local_d8.super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
       _M_impl.super__Vector_impl_data._M_start;
  std::vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_>::vector
            ((vector<VkSubpassDependency,_std::allocator<VkSubpassDependency>_> *)local_180,
             (ulong)(pRVar30->super_RenderPassBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                    .m_Desc.DependencyCount,(allocator_type *)&local_148);
  uVar21 = (pRVar30->super_RenderPassBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
           .m_Desc.DependencyCount;
  if (uVar21 != 0) {
    lVar31 = 0x14;
    lVar32 = 0x18;
    uVar28 = 0;
    do {
      uVar9 = local_180._0_8_;
      pSVar7 = (pRVar30->super_RenderPassBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
               .m_Desc.pDependencies;
      *(undefined4 *)(local_180._0_8_ + lVar32 + -0x18) =
           *(undefined4 *)((long)pSVar7 + lVar31 + -0x14);
      *(undefined4 *)(local_180._0_8_ + lVar32 + -0x14) =
           *(undefined4 *)((long)pSVar7 + lVar31 + -0x10);
      VVar17 = PipelineStageFlagsToVkPipelineStageFlags
                         (*(PIPELINE_STAGE_FLAGS *)((long)pSVar7 + lVar31 + -0xc));
      *(VkPipelineStageFlags *)(uVar9 + lVar32 + -0x10) = VVar17;
      VVar17 = PipelineStageFlagsToVkPipelineStageFlags
                         (*(PIPELINE_STAGE_FLAGS *)((long)pSVar7 + lVar31 + -8));
      *(VkPipelineStageFlags *)(uVar9 + lVar32 + -0xc) = VVar17;
      VVar18 = AccessFlagsToVkAccessFlags(*(ACCESS_FLAGS *)((long)pSVar7 + lVar31 + -4));
      *(VkAccessFlags *)(uVar9 + lVar32 + -8) = VVar18;
      VVar18 = AccessFlagsToVkAccessFlags(*(ACCESS_FLAGS *)((long)&pSVar7->SrcSubpass + lVar31));
      *(VkAccessFlags *)(uVar9 + lVar32 + -4) = VVar18;
      pcVar1 = (pointer)(uVar9 + lVar32);
      pcVar1[0] = '\x01';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      uVar28 = uVar28 + 1;
      uVar21 = (local_158->super_RenderPassBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
               .m_Desc.DependencyCount;
      lVar31 = lVar31 + 0x18;
      lVar32 = lVar32 + 0x1c;
      pRVar30 = local_158;
    } while (uVar28 < uVar21);
  }
  local_88.dependencyCount = uVar21;
  local_88.pDependencies = (VkSubpassDependency *)local_180._0_8_;
  local_148._M_dataplus._M_p = (pointer)0x0;
  local_148.field_2._M_allocated_capacity = 0;
  if ((local_191 == true) && (local_190 != (ShadingRateAttachment *)0x0)) {
    local_148._M_dataplus._M_p = (pointer)0x3b9e1d92;
    local_148.field_2._M_allocated_capacity._4_4_ = 0x3b9e1d90;
    local_148.field_2._M_allocated_capacity._0_4_ = (local_190->Attachment).AttachmentIndex;
    local_88.pNext = &local_148;
  }
  local_148._M_string_length = 0;
  VulkanUtilities::VulkanLogicalDevice::CreateRenderPass
            (&local_48,local_a8,&local_88,
             (pRVar30->super_RenderPassBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8>::
  operator=(&pRVar30->m_VkRenderPass,&local_48);
  VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8>::
  ~VulkanObjectWrapper(&local_48);
  if ((pRVar30->m_VkRenderPass).m_VkObject == (VkRenderPass_T *)0x0) {
    LogError<true,char[36]>
              (false,"CreateRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x15c,(char (*) [36])"Failed to create Vulkan render pass");
  }
  if ((vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)local_180._0_8_ !=
      (vector<VkAttachmentReference,_std::allocator<VkAttachmentReference>_> *)0x0) {
    operator_delete((void *)local_180._0_8_,
                    (long)local_170.
                          super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_start - local_180._0_8_);
  }
  if (local_d8.super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<VkSubpassDescription,_std::allocator<VkSubpassDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_120.
      super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<Diligent::RESOURCE_STATE,_std::allocator<Diligent::RESOURCE_STATE>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a0.
      super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<VkFragmentShadingRateAttachmentInfoKHR,_std::allocator<VkFragmentShadingRateAttachmentInfoKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((AttachmentReference *)
      local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (AttachmentReference *)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<VkAttachmentReference,_std::allocator<VkAttachmentReference>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<VkAttachmentDescription,_std::allocator<VkAttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void RenderPassVkImpl::CreateRenderPass() noexcept(false)
{
    using RenderPassCIType          = std::conditional_t<RPVersion == 2, VkRenderPassCreateInfo2, VkRenderPassCreateInfo>;
    using SubpassDescriptionType    = std::conditional_t<RPVersion == 2, VkSubpassDescription2, VkSubpassDescription>;
    using AttachmentDescriptionType = std::conditional_t<RPVersion == 2, VkAttachmentDescription2, VkAttachmentDescription>;
    using AttachmentReferenceType   = std::conditional_t<RPVersion == 2, VkAttachmentReference2, VkAttachmentReference>;
    using SubpassDependencyType     = std::conditional_t<RPVersion == 2, VkSubpassDependency2, VkSubpassDependency>;

    const auto& LogicalDevice         = m_pDevice->GetLogicalDevice();
    const auto& ExtFeats              = LogicalDevice.GetEnabledExtFeatures();
    const bool  ShadingRateEnabled    = ExtFeats.ShadingRate.attachmentFragmentShadingRate != VK_FALSE;
    const bool  FragDensityMapEnabled = ExtFeats.FragmentDensityMap.fragmentDensityMap != VK_FALSE;

    RenderPassCIType RenderPassCI{};
    RenderPassCI.sType = RPVersion == 2 ? VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO_2 : VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
    RenderPassCI.pNext = nullptr;
    RenderPassCI.flags = 0;

    std::vector<AttachmentDescriptionType> vkAttachments(m_Desc.AttachmentCount);
    for (Uint32 i = 0; i < m_Desc.AttachmentCount; ++i)
    {
        const auto& Attachment   = m_Desc.pAttachments[i];
        auto&       vkAttachment = vkAttachments[i];

        InitAttachmentDescription(vkAttachment);
        vkAttachment.flags          = 0;
        vkAttachment.format         = TexFormatToVkFormat(Attachment.Format);
        vkAttachment.samples        = static_cast<VkSampleCountFlagBits>(Attachment.SampleCount);
        vkAttachment.loadOp         = AttachmentLoadOpToVkAttachmentLoadOp(Attachment.LoadOp);
        vkAttachment.storeOp        = AttachmentStoreOpToVkAttachmentStoreOp(Attachment.StoreOp);
        vkAttachment.stencilLoadOp  = AttachmentLoadOpToVkAttachmentLoadOp(Attachment.StencilLoadOp);
        vkAttachment.stencilStoreOp = AttachmentStoreOpToVkAttachmentStoreOp(Attachment.StencilStoreOp);
        vkAttachment.initialLayout  = ResourceStateToVkImageLayout(Attachment.InitialState, /*IsInsideRenderPass = */ false, FragDensityMapEnabled);
        vkAttachment.finalLayout    = ResourceStateToVkImageLayout(Attachment.FinalState, /*IsInsideRenderPass = */ true, FragDensityMapEnabled);
    }
    RenderPassCI.attachmentCount = m_Desc.AttachmentCount;
    RenderPassCI.pAttachments    = vkAttachments.data();

    Uint32 TotalAttachmentReferencesCount   = 0;
    Uint32 TotalPreserveAttachmentsCount    = 0;
    Uint32 TotalShadingRateAttachmentsCount = 0;
    for (Uint32 i = 0; i < m_Desc.SubpassCount; ++i)
    {
        const auto& Subpass = m_Desc.pSubpasses[i];
        TotalAttachmentReferencesCount += Subpass.InputAttachmentCount;
        TotalAttachmentReferencesCount += Subpass.RenderTargetAttachmentCount;
        if (Subpass.pResolveAttachments != nullptr)
            TotalAttachmentReferencesCount += Subpass.RenderTargetAttachmentCount;
        if (Subpass.pDepthStencilAttachment != nullptr)
            TotalAttachmentReferencesCount += 1;
        if (Subpass.pShadingRateAttachment != nullptr && ShadingRateEnabled)
            TotalShadingRateAttachmentsCount += 1;
        TotalPreserveAttachmentsCount += Subpass.PreserveAttachmentCount;
    }

    std::vector<AttachmentReferenceType>                vkAttachmentReferences(size_t{TotalAttachmentReferencesCount} + size_t{TotalShadingRateAttachmentsCount});
    std::vector<Uint32>                                 vkPreserveAttachments(TotalPreserveAttachmentsCount);
    std::vector<VkFragmentShadingRateAttachmentInfoKHR> vkShadingRate{TotalShadingRateAttachmentsCount};
    const ShadingRateAttachment*                        pMainSRA = nullptr;

    Uint32 CurrAttachmentReferenceInd = 0;
    Uint32 CurrPreserveAttachmentInd  = 0;

    // State flags for every attachment in each subpass.
    // This array is used to detect attachments that are used as render target or depth-stencil,
    // but also as input attachment in the same subpass. Such attachments need to use GENERAL layout.
    std::vector<RESOURCE_STATE> AttachmentStates(m_Desc.AttachmentCount);

    std::vector<SubpassDescriptionType> vkSubpasses(m_Desc.SubpassCount);
    for (Uint32 i = 0, SRInd = 0; i < m_Desc.SubpassCount; ++i)
    {
        const auto& SubpassDesc = m_Desc.pSubpasses[i];
        auto&       vkSubpass   = vkSubpasses[i];

        InitSubpassDescription(vkSubpass);
        vkSubpass.flags             = 0;
        vkSubpass.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;

        std::fill(AttachmentStates.begin(), AttachmentStates.end(), RESOURCE_STATE_UNKNOWN);
        auto UpdateAttachmentsStates = [&AttachmentStates](Uint32 NumAttachments, const AttachmentReference* pSrcAttachments) //
        {
            if (pSrcAttachments == nullptr)
                return;
            for (Uint32 attachment = 0; attachment < NumAttachments; ++attachment)
            {
                const auto& SrcAttachmentRef = pSrcAttachments[attachment];
                if (SrcAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED)
                    AttachmentStates[SrcAttachmentRef.AttachmentIndex] |= SrcAttachmentRef.State;
            }
        };
        UpdateAttachmentsStates(SubpassDesc.InputAttachmentCount, SubpassDesc.pInputAttachments);
        UpdateAttachmentsStates(SubpassDesc.RenderTargetAttachmentCount, SubpassDesc.pRenderTargetAttachments);
        UpdateAttachmentsStates(1, SubpassDesc.pDepthStencilAttachment);

        auto ConvertAttachmentReferences = [&](Uint32 NumAttachments, const AttachmentReference* pSrcAttachments, VkImageAspectFlags AspectMask) //
        {
            auto* pCurrVkAttachmentReference = &vkAttachmentReferences[CurrAttachmentReferenceInd];
            for (Uint32 attachment = 0; attachment < NumAttachments; ++attachment, ++CurrAttachmentReferenceInd)
            {
                const auto& SrcAttachmentRef = pSrcAttachments[attachment];
                auto&       DstAttachmentRef = vkAttachmentReferences[CurrAttachmentReferenceInd];

                InitAttachmentReference(DstAttachmentRef, AspectMask);
                DstAttachmentRef.attachment = SrcAttachmentRef.AttachmentIndex;

                auto State = SrcAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED ?
                    AttachmentStates[SrcAttachmentRef.AttachmentIndex] :
                    SrcAttachmentRef.State;
                if (PlatformMisc::CountOneBits(State) >= 2)
                {
                    // The same attachment is used in different ways in this subpass (e.g. color and input attachments).
                    // It must use COMMON layout.
                    State = RESOURCE_STATE_COMMON;
                }
                else
                {
                    VERIFY_EXPR(State == RESOURCE_STATE_UNKNOWN || State == SrcAttachmentRef.State);
                    State = SrcAttachmentRef.State;
                }

                DstAttachmentRef.layout = ResourceStateToVkImageLayout(State, /*IsInsideRenderPass = */ true, FragDensityMapEnabled);
            }
            return pCurrVkAttachmentReference;
        };

        vkSubpass.inputAttachmentCount = SubpassDesc.InputAttachmentCount;
        if (SubpassDesc.InputAttachmentCount != 0)
        {
            vkSubpass.pInputAttachments = ConvertAttachmentReferences(SubpassDesc.InputAttachmentCount, SubpassDesc.pInputAttachments, VK_IMAGE_ASPECT_COLOR_BIT);
        }

        vkSubpass.colorAttachmentCount = SubpassDesc.RenderTargetAttachmentCount;
        if (SubpassDesc.RenderTargetAttachmentCount != 0)
        {
            vkSubpass.pColorAttachments = ConvertAttachmentReferences(SubpassDesc.RenderTargetAttachmentCount, SubpassDesc.pRenderTargetAttachments, VK_IMAGE_ASPECT_COLOR_BIT);
            if (SubpassDesc.pResolveAttachments != nullptr)
            {
                vkSubpass.pResolveAttachments = ConvertAttachmentReferences(SubpassDesc.RenderTargetAttachmentCount, SubpassDesc.pResolveAttachments, VK_IMAGE_ASPECT_COLOR_BIT);
            }
        }

        if (SubpassDesc.pDepthStencilAttachment != nullptr)
        {
            vkSubpass.pDepthStencilAttachment = ConvertAttachmentReferences(1, SubpassDesc.pDepthStencilAttachment, VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT);
        }

        vkSubpass.preserveAttachmentCount = SubpassDesc.PreserveAttachmentCount;
        if (SubpassDesc.PreserveAttachmentCount != 0)
        {
            vkSubpass.pPreserveAttachments = &vkPreserveAttachments[CurrPreserveAttachmentInd];
            for (Uint32 prsv_attachment = 0; prsv_attachment < SubpassDesc.PreserveAttachmentCount; ++prsv_attachment, ++CurrPreserveAttachmentInd)
            {
                vkPreserveAttachments[CurrPreserveAttachmentInd] = SubpassDesc.pPreserveAttachments[prsv_attachment];
            }
        }

        if (SubpassDesc.pShadingRateAttachment != nullptr)
        {
            if (ShadingRateEnabled)
            {
                const auto& SRAttachment   = *SubpassDesc.pShadingRateAttachment;
                auto&       vkSRAttachment = vkShadingRate[SRInd++];

                SetSubpassDescriptionNext(vkSubpass, &vkSRAttachment);
                vkSRAttachment.pNext                          = nullptr;
                vkSRAttachment.sType                          = VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR;
                vkSRAttachment.pFragmentShadingRateAttachment = reinterpret_cast<const VkAttachmentReference2*>(ConvertAttachmentReferences(1, &SRAttachment.Attachment, VK_IMAGE_ASPECT_COLOR_BIT));
                vkSRAttachment.shadingRateAttachmentTexelSize = {SRAttachment.TileSize[0], SRAttachment.TileSize[1]};
            }
            else
            {
                VERIFY_EXPR(FragDensityMapEnabled);
                pMainSRA = pMainSRA ? pMainSRA : SubpassDesc.pShadingRateAttachment;
            }
        }
    }

    if (FragDensityMapEnabled && pMainSRA != nullptr)
    {
        for (Uint32 i = 0; i < m_Desc.SubpassCount; ++i)
        {
            const auto& SubpassDesc = m_Desc.pSubpasses[i];

            if (SubpassDesc.pShadingRateAttachment == nullptr)
                LOG_ERROR_AND_THROW("Vk_EXT_fragment_density_map extension requires that shading rate attachment is specified for all subpasses");

            if (*pMainSRA != *SubpassDesc.pShadingRateAttachment)
                LOG_ERROR_AND_THROW("Vk_EXT_fragment_density_map extension requires that shading rate attachment is the same for all subpasses");
        }
    }

    VERIFY_EXPR(CurrAttachmentReferenceInd == vkAttachmentReferences.size());
    VERIFY_EXPR(CurrPreserveAttachmentInd == vkPreserveAttachments.size());
    RenderPassCI.subpassCount = m_Desc.SubpassCount;
    RenderPassCI.pSubpasses   = vkSubpasses.data();

    std::vector<SubpassDependencyType> vkDependencies(m_Desc.DependencyCount);
    for (Uint32 i = 0; i < m_Desc.DependencyCount; ++i)
    {
        const auto& DependencyDesc = m_Desc.pDependencies[i];
        auto&       vkDependency   = vkDependencies[i];

        InitSubpassDependency(vkDependency);
        vkDependency.srcSubpass    = DependencyDesc.SrcSubpass;
        vkDependency.dstSubpass    = DependencyDesc.DstSubpass;
        vkDependency.srcStageMask  = PipelineStageFlagsToVkPipelineStageFlags(DependencyDesc.SrcStageMask);
        vkDependency.dstStageMask  = PipelineStageFlagsToVkPipelineStageFlags(DependencyDesc.DstStageMask);
        vkDependency.srcAccessMask = AccessFlagsToVkAccessFlags(DependencyDesc.SrcAccessMask);
        vkDependency.dstAccessMask = AccessFlagsToVkAccessFlags(DependencyDesc.DstAccessMask);

        // VK_DEPENDENCY_BY_REGION_BIT specifies that dependencies will be framebuffer-local.
        // Framebuffer-local dependencies are more optimal for most architectures; particularly
        // tile-based architectures - which can keep framebuffer-regions entirely in on-chip registers
        // and thus avoid external bandwidth across such a dependency. Including a framebuffer-global
        // dependency in your rendering will usually force all implementations to flush data to memory,
        // or to a higher level cache, breaking any potential locality optimizations.
        vkDependency.dependencyFlags = VK_DEPENDENCY_BY_REGION_BIT;
    }
    RenderPassCI.dependencyCount = m_Desc.DependencyCount;
    RenderPassCI.pDependencies   = vkDependencies.data();

    // Enable fragment density map
    VkRenderPassFragmentDensityMapCreateInfoEXT FragDensityMapCI{};
    if (FragDensityMapEnabled && pMainSRA != nullptr)
    {
        RenderPassCI.pNext     = &FragDensityMapCI;
        FragDensityMapCI.sType = VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT;
        FragDensityMapCI.pNext = nullptr;

        FragDensityMapCI.fragmentDensityMapAttachment.attachment = pMainSRA->Attachment.AttachmentIndex;
        FragDensityMapCI.fragmentDensityMapAttachment.layout     = VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
    }

    m_VkRenderPass = LogicalDevice.CreateRenderPass(RenderPassCI, m_Desc.Name);
    if (!m_VkRenderPass)
    {
        LOG_ERROR_AND_THROW("Failed to create Vulkan render pass");
    }
}